

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pStateChangeTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Performance::anon_unknown_0::StateChangeCase::renderTest
          (StateChangeCase *this,Functions *gl)

{
  int iVar1;
  
  if (0 < (this->super_StateChangePerformanceCase).m_callCount) {
    iVar1 = 0;
    do {
      (*(this->super_StateChangePerformanceCase).super_TestCase.super_TestNode._vptr_TestNode[8])
                (this,gl,0);
      deqp::gls::StateChangePerformanceCase::callDraw(&this->super_StateChangePerformanceCase,gl);
      (*(this->super_StateChangePerformanceCase).super_TestCase.super_TestNode._vptr_TestNode[8])
                (this,gl,1);
      deqp::gls::StateChangePerformanceCase::callDraw(&this->super_StateChangePerformanceCase,gl);
      iVar1 = iVar1 + 1;
    } while (iVar1 < (this->super_StateChangePerformanceCase).m_callCount);
  }
  return;
}

Assistant:

void StateChangeCase::renderTest (const glw::Functions& gl)
{
	for (int callNdx = 0; callNdx < m_callCount; callNdx++)
	{
		changeState(gl, 0);
		callDraw(gl);

		changeState(gl, 1);
		callDraw(gl);
	}
}